

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O1

void * raviX_realloc(void *p,size_t size)

{
  void *extraout_RAX;
  void *pvVar1;
  
  pvVar1 = realloc(p,size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  raviX_realloc_cold_1();
  free(p);
  return extraout_RAX;
}

Assistant:

void *raviX_realloc(void *p, size_t size)
{
	void *ptr;
	ptr = realloc(p, size);
        if (!ptr) {
                fprintf(stderr, "out of memory\n");
                exit(1);
        }
	return ptr;
}